

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.cpp
# Opt level: O3

size_t __thiscall kiste::line_data_t::add_segment(line_data_t *this,segment_t *segment)

{
  size_type sVar1;
  size_type sVar2;
  
  if (segment->_type == text) {
    sVar1 = (segment->_text)._M_string_length;
    if (sVar1 != 0) {
      sVar2 = 0;
      do {
        enforce_trailing_text_segment(this);
        std::__cxx11::string::push_back
                  ((char)(this->_segments).
                         super__Vector_base<kiste::segment_t,_std::allocator<kiste::segment_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish + -0x20);
        sVar2 = sVar2 + 1;
      } while (sVar1 != sVar2);
    }
  }
  else {
    std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::push_back
              (&this->_segments,segment);
  }
  return segment->_end_pos;
}

Assistant:

auto line_data_t::add_segment(const segment_t& segment) -> size_t
  {
    switch (segment._type)
    {
    case segment_type::text:
      for (const auto c : segment._text)
      {
        add_character(c);
      }
      break;
    default:
      _segments.push_back(segment);
      break;
    }

    return segment._end_pos;
  }